

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayGet(InfoCollector *this,ArrayGet *curr)

{
  bool bVar1;
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  local_38;
  
  if (curr->ref != (Expression *)0x0) {
    bVar1 = isRelevant((InfoCollector *)(curr->ref->type).id,(Type)curr);
    if (bVar1) {
      addChildParentLink(this,curr->ref,(Expression *)curr);
      return;
    }
  }
  local_38._M_index = '\x04';
  addRoot(this,(Expression *)curr,(PossibleContents *)&local_38);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
  ::~_Variant_storage(&local_38);
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    if (!isRelevant(curr->ref)) {
      addRoot(curr);
      return;
    }
    addChildParentLink(curr->ref, curr);
  }